

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_iris.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Dataset *d)

{
  pointer pvVar1;
  pointer __v;
  valarray<float> v;
  valarray<float> vStack_38;
  
  pvVar1 = (d->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__v = (d->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start; __v != pvVar1; __v = __v + 1) {
    notch::core::std::valarray<float>::valarray(&vStack_38,__v);
    notch::io::operator<<(out,&vStack_38);
    std::operator<<(out,"\n");
    operator_delete(vStack_38._M_data);
  }
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Dataset &d) {
    for (auto v : d) {
        out << v << "\n";
    }
    return out;
}